

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue_p.h
# Opt level: O0

QCborValueConstRef __thiscall
QCborContainerPrivate::findCborMapKey<QLatin1String>(QCborContainerPrivate *this,QLatin1String key)

{
  QCborValueConstRef QVar1;
  QLatin1String s;
  bool bVar2;
  qsizetype qVar3;
  const_reference pEVar4;
  QCborContainerPrivate *in_RDI;
  long in_FS_OFFSET;
  bool equals;
  Element *e;
  qsizetype i;
  qsizetype in_stack_ffffffffffffff88;
  QList<QtCbor::Element> *in_stack_ffffffffffffff90;
  QCborContainerPrivate *this_00;
  QCborContainerPrivate *pQVar5;
  QCborValueConstRef local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QCborContainerPrivate *)0x0;
  while (pQVar5 = this_00, qVar3 = QList<QtCbor::Element>::size(&in_RDI->elements),
        (long)this_00 < qVar3) {
    pEVar4 = QList<QtCbor::Element>::at(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    s.m_data = (char *)pQVar5;
    s.m_size = (qsizetype)pEVar4;
    bVar2 = stringEqualsElement<QLatin1String>(this_00,(qsizetype)in_stack_ffffffffffffff90,s);
    if (bVar2) break;
    this_00 = (QCborContainerPrivate *)
              ((long)&(pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.
                      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 2);
  }
  QCborValueConstRef::QCborValueConstRef
            (&local_18,in_RDI,
             (qsizetype)
             ((long)&(pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  QVar1.i = local_18.i;
  QVar1.d = local_18.d;
  return QVar1;
}

Assistant:

QCborValueConstRef findCborMapKey(KeyType key)
    {
        qsizetype i = 0;
        for ( ; i < elements.size(); i += 2) {
            const auto &e = elements.at(i);
            bool equals;
            if constexpr (std::is_same_v<std::decay_t<KeyType>, QCborValue>) {
                equals = (compareElement(i, key, QtCbor::Comparison::ForEquality) == 0);
            } else if constexpr (std::is_integral_v<KeyType>) {
                equals = (e.type == QCborValue::Integer && e.value == key);
            } else {
                // assume it's a string
                equals = stringEqualsElement(i, key);
            }
            if (equals)
                break;
        }
        return { this, i + 1 };
    }